

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void update_flags(dw_rom *rom)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uStack_18;
  uint8_t tmp;
  size_t i;
  dw_rom *rom_local;
  
  for (uStack_18 = 0; uStack_18 < 0xd; uStack_18 = uStack_18 + 1) {
    bVar1 = rom->flags[uStack_18];
    uVar2 = mt_rand(0,0xff);
    rom->flags[uStack_18] =
         rom->flags[uStack_18] | (byte)((int)(uint)bVar1 >> 1) & 0x55 & (byte)uVar2;
    rom->flags[uStack_18] = rom->flags[uStack_18] & 0x55;
  }
  if ((rom->flags[0xd] & 0xc0) == 0xc0) {
    rom->flags[0xd] = rom->flags[0xd] & 0x3f;
    uVar2 = mt_rand(0,2);
    rom->flags[0xd] = rom->flags[0xd] | (byte)(uVar2 << 6);
  }
  return;
}

Assistant:

static void update_flags(dw_rom *rom)
{
    size_t i;
    uint8_t tmp;

    /* The last 2 bytes do not contain maybe flags. */
    for (i=0; i < 13; i++) {
        rom->flags[i] |= (rom->flags[i] >> 1) & 0x55 & mt_rand(0, 0xff);
        rom->flags[i] &= 0x55;
    }
    if (RANDOM_MAP_SIZE(rom) == 0xc0) {
        rom->flags[13] &= 0x3f;
        rom->flags[13] |= mt_rand(0, 2) << 6;
    }
}